

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ip4-addr.c
# Opt level: O0

int run_test_ip4_addr(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char local_28 [8];
  char dst [16];
  sockaddr_in addr;
  
  iVar1 = uv_inet_ntop(2,anon_var_dwarf_2383a,local_28,0x10);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip4-addr.c"
            ,0x21,"0 == uv_inet_ntop(AF_INET, \"\\xFF\\xFF\\xFF\\xFF\", dst, sizeof(dst))");
    abort();
  }
  iVar1 = strcmp(local_28,"255.255.255.255");
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip4-addr.c"
            ,0x22,"0 == strcmp(dst, \"255.255.255.255\")");
    abort();
  }
  iVar1 = uv_inet_ntop(2,anon_var_dwarf_2383a,local_28,0xf);
  if (iVar1 != -0x1c) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip4-addr.c"
            ,0x24,
            "UV_ENOSPC == uv_inet_ntop(AF_INET, \"\\xFF\\xFF\\xFF\\xFF\", dst, sizeof(dst) - 1)");
    abort();
  }
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)(dst + 8));
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip4-addr.c"
            ,0x26,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)");
    abort();
  }
  iVar1 = uv_ip4_addr("255.255.255.255",0x23a3,(sockaddr_in *)(dst + 8));
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip4-addr.c"
            ,0x27,"0 == uv_ip4_addr(\"255.255.255.255\", TEST_PORT, &addr)");
    abort();
  }
  iVar1 = uv_ip4_addr("255.255.255*000",0x23a3,(sockaddr_in *)(dst + 8));
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip4-addr.c"
            ,0x28,"UV_EINVAL == uv_ip4_addr(\"255.255.255*000\", TEST_PORT, &addr)");
    abort();
  }
  iVar1 = uv_ip4_addr("255.255.255.256",0x23a3,(sockaddr_in *)(dst + 8));
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip4-addr.c"
            ,0x29,"UV_EINVAL == uv_ip4_addr(\"255.255.255.256\", TEST_PORT, &addr)");
    abort();
  }
  iVar1 = uv_ip4_addr("2555.0.0.0",0x23a3,(sockaddr_in *)(dst + 8));
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip4-addr.c"
            ,0x2a,"UV_EINVAL == uv_ip4_addr(\"2555.0.0.0\", TEST_PORT, &addr)");
    abort();
  }
  iVar1 = uv_ip4_addr("255",0x23a3,(sockaddr_in *)(dst + 8));
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip4-addr.c"
            ,0x2b,"UV_EINVAL == uv_ip4_addr(\"255\", TEST_PORT, &addr)");
    abort();
  }
  iVar1 = uv_inet_pton(0x2a,"127.0.0.1",dst + 0xc);
  if (iVar1 != -0x61) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip4-addr.c"
            ,0x33,"UV_EAFNOSUPPORT == uv_inet_pton(42, \"127.0.0.1\", &addr.sin_addr.s_addr)");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip4-addr.c"
            ,0x35,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(ip4_addr) {
  struct sockaddr_in addr;
  char dst[16];

  ASSERT(0 == uv_inet_ntop(AF_INET, "\xFF\xFF\xFF\xFF", dst, sizeof(dst)));
  ASSERT(0 == strcmp(dst, "255.255.255.255"));
  ASSERT(UV_ENOSPC == uv_inet_ntop(AF_INET, "\xFF\xFF\xFF\xFF",
                                   dst, sizeof(dst) - 1));

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT(0 == uv_ip4_addr("255.255.255.255", TEST_PORT, &addr));
  ASSERT(UV_EINVAL == uv_ip4_addr("255.255.255*000", TEST_PORT, &addr));
  ASSERT(UV_EINVAL == uv_ip4_addr("255.255.255.256", TEST_PORT, &addr));
  ASSERT(UV_EINVAL == uv_ip4_addr("2555.0.0.0", TEST_PORT, &addr));
  ASSERT(UV_EINVAL == uv_ip4_addr("255", TEST_PORT, &addr));

#ifdef SIN6_LEN
  ASSERT(addr.sin_len == sizeof(addr));
#endif

  /* for broken address family */
  ASSERT(UV_EAFNOSUPPORT == uv_inet_pton(42, "127.0.0.1",
    &addr.sin_addr.s_addr));

  MAKE_VALGRIND_HAPPY();
  return 0;
}